

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

StringPtr * __thiscall
kj::
Table<kj::HashMap<int,_kj::StringPtr>::Entry,_kj::HashIndex<kj::HashMap<int,_kj::StringPtr>::Callbacks>_>
::insert(Table<kj::HashMap<int,_kj::StringPtr>::Entry,_kj::HashIndex<kj::HashMap<int,_kj::StringPtr>::Callbacks>_>
         *this,StringPtr *row)

{
  bool bVar1;
  uint skip;
  size_t pos;
  StringPtr *pSVar2;
  Maybe<unsigned_long> local_28;
  StringPtr *local_18;
  StringPtr *row_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  local_18 = row;
  row_local = (StringPtr *)this;
  pos = Vector<kj::HashMap<int,_kj::StringPtr>::Entry>::size
                  ((Vector<kj::HashMap<int,_kj::StringPtr>::Entry> *)this);
  pSVar2 = local_18;
  skip = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&local_28,
             (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             this,pos,pSVar2,skip);
  bVar1 = Maybe<unsigned_long>::operator==(&local_28);
  Maybe<unsigned_long>::~Maybe(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pSVar2 = mv<kj::HashMap<int,kj::StringPtr>::Entry>(local_18);
    pSVar2 = Vector<kj::HashMap<int,kj::StringPtr>::Entry>::
             add<kj::HashMap<int,kj::StringPtr>::Entry>
                       ((Vector<kj::HashMap<int,kj::StringPtr>::Entry> *)this,pSVar2);
    return pSVar2;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}